

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.h
# Opt level: O0

void rtree_leaf_elm_slab_write(tsdn_t *tsdn,rtree_t *rtree,rtree_leaf_elm_t *elm,_Bool slab)

{
  void *result;
  uintptr_t bits;
  uintptr_t old_bits;
  _Bool slab_local;
  rtree_leaf_elm_t *elm_local;
  rtree_t *rtree_local;
  tsdn_t *tsdn_local;
  
  (elm->le_bits).repr =
       (void *)((ulong)(elm->le_bits).repr & 0xfffffffffffffffe | (ulong)(slab & 1));
  return;
}

Assistant:

static inline void
rtree_leaf_elm_slab_write(tsdn_t *tsdn, rtree_t *rtree,
    rtree_leaf_elm_t *elm, bool slab) {
#ifdef RTREE_LEAF_COMPACT
	uintptr_t old_bits = rtree_leaf_elm_bits_read(tsdn, rtree, elm,
	    true);
	uintptr_t bits = ((uintptr_t)rtree_leaf_elm_bits_szind_get(old_bits) <<
	    LG_VADDR) | ((uintptr_t)rtree_leaf_elm_bits_extent_get(old_bits) &
	    (((uintptr_t)0x1 << LG_VADDR) - 1)) | ((uintptr_t)slab);
	atomic_store_p(&elm->le_bits, (void *)bits, ATOMIC_RELEASE);
#else
	atomic_store_b(&elm->le_slab, slab, ATOMIC_RELEASE);
#endif
}